

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port_attribute.c
# Opt level: O1

apx_portAttributes_t * apx_portAttributes_new(void)

{
  apx_portAttributes_t *paVar1;
  
  paVar1 = (apx_portAttributes_t *)malloc(0x10);
  if (paVar1 != (apx_portAttributes_t *)0x0) {
    paVar1->is_parameter = false;
    paVar1->queue_length = 0;
    paVar1->init_value = (dtl_dv_t *)0x0;
  }
  return paVar1;
}

Assistant:

apx_portAttributes_t* apx_portAttributes_new(void)
{
   apx_portAttributes_t *self = (apx_portAttributes_t*) 0;
   self = (apx_portAttributes_t*) malloc(sizeof(apx_portAttributes_t));
   if (self != NULL)
   {
      apx_portAttributes_create(self);
   }
   return self;
}